

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O2

void __thiscall Imf_3_2::DeepScanLineInputFile::~DeepScanLineInputFile(DeepScanLineInputFile *this)

{
  IStream *pIVar1;
  pointer ppLVar2;
  char *pcVar3;
  Data *this_00;
  size_t i;
  ulong uVar4;
  
  (this->super_GenericInputFile)._vptr_GenericInputFile =
       (_func_int **)&PTR__DeepScanLineInputFile_003d33c8;
  this_00 = this->_data;
  if ((this_00->_deleteStream == true) &&
     (pIVar1 = this_00->_streamData->is, pIVar1 != (IStream *)0x0)) {
    (*pIVar1->_vptr_IStream[1])();
    this_00 = this->_data;
    if (this_00 == (Data *)0x0) goto LAB_00162f34;
  }
  if (this_00->memoryMapped == false) {
    for (uVar4 = 0;
        ppLVar2 = (this_00->lineBuffers).
                  super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        uVar4 < (ulong)((long)(this_00->lineBuffers).
                              super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar2 >> 3);
        uVar4 = uVar4 + 1) {
      pcVar3 = ppLVar2[uVar4]->buffer;
      if (pcVar3 != (char *)0x0) {
        operator_delete__(pcVar3);
        this_00 = this->_data;
      }
    }
  }
  if ((this_00->partNumber == -1) && (this_00->_streamData != (InputStreamMutex *)0x0)) {
    operator_delete(this_00->_streamData,0x38);
    this_00 = this->_data;
    if (this_00 != (Data *)0x0) goto LAB_00162f1f;
    this_00 = (Data *)0x0;
  }
  else {
LAB_00162f1f:
    Data::~Data(this_00);
  }
  operator_delete(this_00,0x208);
LAB_00162f34:
  GenericInputFile::~GenericInputFile(&this->super_GenericInputFile);
  return;
}

Assistant:

DeepScanLineInputFile::~DeepScanLineInputFile ()
{
    if (_data->_deleteStream) delete _data->_streamData->is;

    if (_data)
    {
        if (!_data->memoryMapped)
            for (size_t i = 0; i < _data->lineBuffers.size (); i++)
                delete[] _data->lineBuffers[i]->buffer;

        //
        // Unless this file was opened via the multipart API, delete the streamdata
        // object too.
        // (TODO) it should be "isMultiPart(data->version)", but when there is only
        // single part,
        // (see the above constructor) the version field is not set.
        //
        // (TODO) we should have a way to tell if the stream data is owned by this
        // file or by a parent multipart file.
        //

        if (_data->partNumber == -1 && _data->_streamData)
        {
            delete _data->_streamData;
        }
        delete _data;
    }
}